

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb_malloc_validate(void *p,void *parent)

{
  long *plVar1;
  long lVar2;
  void *p_00;
  undefined8 *puVar3;
  long *plVar4;
  long *plVar5;
  
  if (p != (void *)0x0) {
    do {
      plVar1 = *(long **)((long)p + -8);
      switch((uint)plVar1 & 3) {
      case 0:
        if ((plVar1 != (long *)0x0) && ((long *)*plVar1 != (long *)p)) {
          __assert_fail("*n->prevn == p",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0xa31,"void stb_malloc_validate(void *, void *)");
        }
        p = (void *)((long)p + -0x10);
        lVar2 = *p;
        if (lVar2 == 0) {
          return;
        }
        puVar3 = (undefined8 *)(lVar2 + -0x20);
        if ((*(uint *)(lVar2 + -8) & 3) != 2) {
          puVar3 = (undefined8 *)(lVar2 + -8);
        }
        if ((long *)*puVar3 != (long *)p) {
          __assert_fail("*stb__prevn(n->next) == &n->next",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0xa33,"void stb_malloc_validate(void *, void *)");
        }
        break;
      case 1:
        goto switchD_0014e8c8_caseD_1;
      case 2:
        if ((*(undefined8 **)((long)p + -0x20) != (undefined8 *)0x0) &&
           ((long *)**(undefined8 **)((long)p + -0x20) != (long *)p)) {
          __assert_fail("*s->prevn == p",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0xa3c,"void stb_malloc_validate(void *, void *)");
        }
        p_00 = *(void **)((long)p + -0x18);
        if (p_00 != (void *)0x0) {
          puVar3 = (undefined8 *)((long)p_00 + -0x20);
          if ((*(uint *)((long)p_00 + -8) & 3) != 2) {
            puVar3 = (undefined8 *)((long)p_00 + -8);
          }
          if ((long *)*puVar3 != (long *)((long)p + -0x18)) {
            __assert_fail("*stb__prevn(s->child) == &s->child",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                          ,0xa3f,"void stb_malloc_validate(void *, void *)");
          }
          stb_malloc_validate(p_00,puVar3);
        }
        plVar1 = *(long **)((long)p + -0x10);
        if (plVar1 == (long *)0x0) {
          return;
        }
        plVar4 = (long *)((long)p + -0x10);
        plVar5 = plVar1 + -4;
        if ((*(uint *)(plVar1 + -1) & 3) != 2) {
          plVar5 = plVar1 + -1;
        }
        p = plVar1;
        if ((long *)*plVar5 != plVar4) {
          __assert_fail("*stb__prevn(s->next) == &s->next",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0xa44,"void stb_malloc_validate(void *, void *)");
        }
        break;
      case 3:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0xa4a,"void stb_malloc_validate(void *, void *)");
      }
    } while( true );
  }
switchD_0014e8c8_caseD_1:
  return;
}

Assistant:

void stb_malloc_validate(void *p, void *parent)
{
   if (p == NULL) return;

   switch(stb__identify(p)) {
      case STB__chunked:
         return;
      case STB__nochildren: {
         stb__nochildren *n = (stb__nochildren *) p - 1;
         if (n->prevn)
            assert(*n->prevn == p);
         if (n->next) {
            assert(*stb__prevn(n->next) == &n->next);
            stb_malloc_validate(n, parent);
         }
         return;
      }
      case STB__alloc: {
         stb__alloc *s = (stb__alloc *) p - 1;

         if (s->prevn)
            assert(*s->prevn == p);

         if (s->child) {
            assert(*stb__prevn(s->child) == &s->child);
            stb_malloc_validate(s->child, p);
         }

         if (s->next) {
            assert(*stb__prevn(s->next) == &s->next);
            stb_malloc_validate(s->next, parent);
         }
         return;
      }
      default:
         assert(0); /* NOTREACHED */
   }
}